

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void crc_calculator_process_data
               (CRC_CALCULATOR *p_crc_calculator,uint8_t *pData,uint32_t dataLength)

{
  byte bVar1;
  uint uVar2;
  uint8_t index;
  uint32_t i;
  uint32_t dataLength_local;
  uint8_t *pData_local;
  CRC_CALCULATOR *p_crc_calculator_local;
  
  for (i = 0; i < dataLength; i = i + 1) {
    uVar2 = p_crc_calculator->remainder;
    bVar1 = pData[i];
    p_crc_calculator->remainder = p_crc_calculator->remainder << 8;
    p_crc_calculator->remainder =
         p_crc_calculator->table
         [(byte)((byte)(uVar2 >> ((char)p_crc_calculator->bits - 8U & 0x1f)) ^ bVar1)] ^
         p_crc_calculator->remainder;
  }
  return;
}

Assistant:

static void crc_calculator_process_data(CRC_CALCULATOR *p_crc_calculator,
                                        uint8_t *pData, uint32_t dataLength) {
  for (uint32_t i = 0; i < dataLength; i++) {
    const uint8_t index = (uint8_t)((p_crc_calculator->remainder >>
                                     (p_crc_calculator->bits - 8)) ^
                                    pData[i]);
    p_crc_calculator->remainder <<= 8;
    p_crc_calculator->remainder ^= p_crc_calculator->table[index];
  }
}